

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O3

boolean lib_dlb_fopen(dlb *dp,char *name,char *mode)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  int i;
  long lVar4;
  
  lVar4 = 0;
  do {
    if (dlb_libs[lVar4].fdata == (FILE *)0x0) {
      return '\0';
    }
    lVar2 = dlb_libs[lVar4].nentries;
    if (0 < lVar2) {
      plVar3 = &(dlb_libs[lVar4].dir)->foffset;
      do {
        iVar1 = strcmp(name,((libdir *)(plVar3 + -1))->fname);
        if (iVar1 == 0) {
          dp->lib = dlb_libs + lVar4;
          lVar4 = plVar3[1];
          dp->start = *plVar3;
          dp->size = lVar4;
          dp->mark = 0;
          return '\x01';
        }
        plVar3 = plVar3 + 4;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return '\0';
}

Assistant:

static boolean lib_dlb_fopen(dlb *dp, const char *name, const char *mode)
{
    long start, size;
    library *lp;

    /* look up file in directory */
    if (find_file(name, &lp, &start, &size)) {
	dp->lib = lp;
	dp->start = start;
	dp->size = size;
	dp->mark = 0;
	return TRUE;
	}

    return FALSE;	/* failed */
}